

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall Fl_Text_Display::next_word(Fl_Text_Display *this)

{
  uint uVar1;
  int iVar2;
  int pos;
  Fl_Text_Buffer *this_00;
  
  pos = this->mCursorPos;
  this_00 = this->mBuffer;
  iVar2 = this_00->mLength;
  if (pos < iVar2) {
    do {
      uVar1 = Fl_Text_Buffer::char_at(this_00,pos);
      if ((uVar1 != 0x24) && (uVar1 != 0x5f)) {
        iVar2 = isspace(uVar1);
        if (iVar2 != 0) break;
        iVar2 = ispunct(uVar1);
        if (iVar2 != 0) break;
      }
      pos = Fl_Text_Buffer::next_char(this->mBuffer,pos);
      this_00 = this->mBuffer;
    } while (pos < this_00->mLength);
    this_00 = this->mBuffer;
    iVar2 = this_00->mLength;
  }
  if (pos < iVar2) {
    do {
      uVar1 = Fl_Text_Buffer::char_at(this_00,pos);
      if ((uVar1 == 0x24) || (uVar1 == 0x5f)) break;
      iVar2 = isspace(uVar1);
      if (iVar2 == 0) {
        iVar2 = ispunct(uVar1);
        if (iVar2 == 0) break;
      }
      pos = Fl_Text_Buffer::next_char(this->mBuffer,pos);
      this_00 = this->mBuffer;
    } while (pos < this_00->mLength);
  }
  insert_position(this,pos);
  return;
}

Assistant:

void Fl_Text_Display::next_word() {
  int pos = insert_position();

  while (pos < buffer()->length() && !fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  while (pos < buffer()->length() && fl_isseparator(buffer()->char_at(pos))) {
    pos = buffer()->next_char(pos);
  }

  insert_position( pos );
}